

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O2

uint32_t findConverter(char *alias,UBool *containsOption,UErrorCode *pErrorCode)

{
  uint16_t uVar1;
  ushort uVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  UConverterAliasOptions *pUVar5;
  uint16_t *puVar6;
  uint16_t *puVar7;
  uint uVar8;
  int iVar9;
  size_t sVar10;
  uint uVar11;
  uint32_t uVar12;
  uint uVar13;
  uint uVar14;
  char strippedName [60];
  
  pUVar5 = gMainTable.optionTable;
  uVar1 = (gMainTable.optionTable)->stringNormalizationType;
  if (uVar1 != 0) {
    sVar10 = strlen(alias);
    if (0x3b < sVar10) {
      *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
      return 0xffffffff;
    }
    ucnv_io_stripASCIIForCompare_63(strippedName,alias);
    alias = strippedName;
  }
  puVar7 = gMainTable.normalizedStringTable;
  puVar6 = gMainTable.stringTable;
  puVar3 = gMainTable.aliasList;
  uVar11 = 0xffffffff;
  uVar8 = gMainTable.untaggedConvArraySize;
  uVar14 = 0;
  do {
    uVar12 = uVar8;
    uVar13 = uVar14 + uVar12 >> 1;
    if (uVar11 == uVar13) {
      return 0xffffffff;
    }
    if (uVar1 == 0) {
      iVar9 = ucnv_compareNames_63(alias,(char *)(puVar6 + puVar3[uVar13]));
    }
    else {
      iVar9 = strcmp(alias,(char *)(puVar7 + puVar3[uVar13]));
    }
    puVar4 = gMainTable.untaggedConvArray;
    uVar11 = uVar13;
    uVar8 = uVar13;
  } while ((iVar9 < 0) || (uVar8 = uVar12, uVar14 = uVar13, iVar9 != 0));
  uVar2 = gMainTable.untaggedConvArray[uVar13];
  if ((short)uVar2 < 0) {
    *pErrorCode = U_AMBIGUOUS_ALIAS_WARNING;
  }
  if (containsOption != (UBool *)0x0) {
    *containsOption = (byte)(uVar2 >> 0xe) & 1 | (char)pUVar5->containsCnvOptionInfo == '\0';
    uVar2 = puVar4[uVar13];
  }
  return uVar2 & 0xfff;
}

Assistant:

static inline uint32_t
findConverter(const char *alias, UBool *containsOption, UErrorCode *pErrorCode) {
    uint32_t mid, start, limit;
    uint32_t lastMid;
    int result;
    int isUnnormalized = (gMainTable.optionTable->stringNormalizationType == UCNV_IO_UNNORMALIZED);
    char strippedName[UCNV_MAX_CONVERTER_NAME_LENGTH];

    if (!isUnnormalized) {
        if (uprv_strlen(alias) >= UCNV_MAX_CONVERTER_NAME_LENGTH) {
            *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
            return UINT32_MAX;
        }

        /* Lower case and remove ignoreable characters. */
        ucnv_io_stripForCompare(strippedName, alias);
        alias = strippedName;
    }

    /* do a binary search for the alias */
    start = 0;
    limit = gMainTable.untaggedConvArraySize;
    mid = limit;
    lastMid = UINT32_MAX;

    for (;;) {
        mid = (uint32_t)((start + limit) / 2);
        if (lastMid == mid) {   /* Have we moved? */
            break;  /* We haven't moved, and it wasn't found. */
        }
        lastMid = mid;
        if (isUnnormalized) {
            result = ucnv_compareNames(alias, GET_STRING(gMainTable.aliasList[mid]));
        }
        else {
            result = uprv_strcmp(alias, GET_NORMALIZED_STRING(gMainTable.aliasList[mid]));
        }

        if (result < 0) {
            limit = mid;
        } else if (result > 0) {
            start = mid;
        } else {
            /* Since the gencnval tool folds duplicates into one entry,
             * this alias in gAliasList is unique, but different standards
             * may map an alias to different converters.
             */
            if (gMainTable.untaggedConvArray[mid] & UCNV_AMBIGUOUS_ALIAS_MAP_BIT) {
                *pErrorCode = U_AMBIGUOUS_ALIAS_WARNING;
            }
            /* State whether the canonical converter name contains an option.
            This information is contained in this list in order to maintain backward & forward compatibility. */
            if (containsOption) {
                UBool containsCnvOptionInfo = (UBool)gMainTable.optionTable->containsCnvOptionInfo;
                *containsOption = (UBool)((containsCnvOptionInfo
                    && ((gMainTable.untaggedConvArray[mid] & UCNV_CONTAINS_OPTION_BIT) != 0))
                    || !containsCnvOptionInfo);
            }
            return gMainTable.untaggedConvArray[mid] & UCNV_CONVERTER_INDEX_MASK;
        }
    }

    return UINT32_MAX;
}